

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *pNtkBase,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  long *plVar1;
  Abc_Ntk_t *pNtkNew;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  
  if (pNtkBase->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1d3,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1d4,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkBase->nBarBufs != pNtkBase->nObjCounts[8]) {
    __assert_fail("pNtkBase->nBarBufs == Abc_NtkLatchNum(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1d5,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pNtkNew = Abc_NtkStartFrom(pNtkBase,ABC_NTK_LOGIC,pNtk->ntkFunc);
  pVVar3 = pNtk->vPis;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      if (pNtkNew->vPis->nSize <= lVar2) goto LAB_001ba254;
      *(void **)((long)pVVar3->pArray[lVar2] + 0x40) = pNtkNew->vPis->pArray[lVar2];
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vPis;
    } while (lVar2 < pVVar3->nSize);
  }
  pVVar3 = pNtk->vObjs;
  if (pVVar3->nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar2 = 0;
    uVar5 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar2];
      if ((pObj != (Abc_Obj_t *)0x0) && (bVar7 = (*(uint *)&pObj->field_0x14 & 0xf) != 7, !bVar7)) {
        if ((bVar7) ||
           (((pObj->pNtk->ntkFunc != ABC_FUNC_MAP || ((pObj->vFanins).nSize != 1)) ||
            ((pObj->field_5).pData != (void *)0x0)))) {
          Abc_NtkDupObj(pNtkNew,pObj,1);
          if (0 < (pObj->vFanins).nSize) {
            lVar6 = 0;
            do {
              Abc_ObjAddFanin((pObj->field_6).pCopy,
                              *(Abc_Obj_t **)
                               ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]] +
                               0x40));
              lVar6 = lVar6 + 1;
            } while (lVar6 < (pObj->vFanins).nSize);
          }
        }
        else {
          if (((int)uVar5 < 0) || (pNtkNew->vBoxes->nSize <= (int)uVar5)) goto LAB_001ba254;
          uVar4 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          plVar1 = (long *)pNtkNew->vBoxes->pArray[uVar4];
          Abc_ObjAddFanin(*(Abc_Obj_t **)
                           (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8),
                          *(Abc_Obj_t **)
                           ((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x40));
          pObj->field_6 =
               *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
        }
      }
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar2 < pVVar3->nSize);
  }
  if (uVar5 != pNtkBase->nBarBufs) {
    __assert_fail("nBarBufs == pNtkBase->nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1ec,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pVVar3 = pNtk->vPos;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      if (pNtkNew->vPos->nSize <= lVar2) {
LAB_001ba254:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pNtkNew->vPos->pArray[lVar2],
                      *(Abc_Obj_t **)
                       (*(long *)(*(long *)(*(long *)(*pVVar3->pArray[lVar2] + 0x20) + 8) +
                                 (long)**(int **)((long)pVVar3->pArray[lVar2] + 0x20) * 8) + 0x40));
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vPos;
    } while (lVar2 < pVVar3->nSize);
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkBarBufsFromBuffers( Abc_Ntk_t * pNtkBase, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin, * pLatch;
    int i, k, nBarBufs;
    assert( Abc_NtkIsLogic(pNtkBase) );
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtkBase->nBarBufs == Abc_NtkLatchNum(pNtkBase) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtkBase, pNtk->ntkType, pNtk->ntkFunc );
    // transfer PI pointers
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPi(pNtkNew, i);
    // assuming that the order/number of barbufs remains the same
    nBarBufs = 0;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjIsBarBuf(pObj) )
        {
            pLatch = Abc_NtkBox(pNtkNew, nBarBufs++);
            Abc_ObjAddFanin( Abc_ObjFanin0(pLatch), Abc_ObjFanin0(pObj)->pCopy );
            pObj->pCopy = Abc_ObjFanout0(pLatch);
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    assert( nBarBufs == pNtkBase->nBarBufs );
    // connect POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAddFanin( Abc_NtkPo(pNtkNew, i), Abc_ObjFanin0(pObj)->pCopy );
    return pNtkNew;
}